

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

void glBindFramebuffer_shim_for_scaling(GLenum target,GLuint name)

{
  if (target == 0x8d40) {
LAB_0010cf64:
    OpenGLCurrentReadFBO = OpenGLLogicalScalingMultisampleFBO;
    if (OpenGLLogicalScalingMultisampleFBO == 0) {
      OpenGLCurrentReadFBO = OpenGLLogicalScalingFBO;
    }
    if (name != 0) {
      OpenGLCurrentReadFBO = name;
    }
    if ((target != 0x8d40) && (target != 0x8ca9)) goto LAB_0010cf9f;
  }
  else if (target != 0x8ca9) {
    if (target != 0x8ca8) goto LAB_0010cf9f;
    goto LAB_0010cf64;
  }
  OpenGLCurrentDrawFBO = name;
  if (name == 0) {
    OpenGLCurrentDrawFBO = OpenGLLogicalScalingFBO;
  }
LAB_0010cf9f:
  if (OpenGLCurrentReadFBO != OpenGLLogicalScalingMultisampleFBO ||
      OpenGLLogicalScalingMultisampleFBO == 0) {
    (*OpenGLFuncs.glBindFramebuffer)(0x8ca8,OpenGLCurrentReadFBO);
    (*OpenGLFuncs.glBindFramebuffer)(0x8ca9,OpenGLCurrentDrawFBO);
    return;
  }
  ResolveFauxBackbufferMSAA();
  return;
}

Assistant:

static void GLAPIENTRY
glBindFramebuffer_shim_for_scaling(GLenum target, GLuint name)
{
    /* OpenGLLogicalScaling{Multisample,}FBO will be zero if we aren't scaling, making this use the default. */

    /* We always cache the current framebuffer when it's changed here, so we don't have
       to repeatedly ask OpenGL what the current framebuffer is, and so we can only force
       resolves if the currently bound read FBO is the default. */
    if ((target == GL_READ_FRAMEBUFFER) || (target == GL_FRAMEBUFFER)) {
        if (OpenGLLogicalScalingMultisampleFBO) {
            /* We need to read from a resolves FBO if multisampling is enabled. */
            OpenGLCurrentReadFBO = (name == 0) ? OpenGLLogicalScalingMultisampleFBO : name;
        } else {
            OpenGLCurrentReadFBO = (name == 0) ? OpenGLLogicalScalingFBO : name;
        }
    }

    if ((target == GL_DRAW_FRAMEBUFFER) || (target == GL_FRAMEBUFFER)) {
        OpenGLCurrentDrawFBO = (name == 0) ? OpenGLLogicalScalingFBO : name;
    }

    /* If multisampling is enabled, and we're trying using the default framebuffer, do a multisample resolve. */
    if (OpenGLLogicalScalingMultisampleFBO && (OpenGLCurrentReadFBO == OpenGLLogicalScalingMultisampleFBO)) {
        ResolveFauxBackbufferMSAA();
    } else {
        /* ResolveFauxBackbufferMSAA() will bind the framebuffers, otherwise we have to do it manually */
        OpenGLFuncs.glBindFramebuffer(GL_READ_FRAMEBUFFER, OpenGLCurrentReadFBO);
        OpenGLFuncs.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, OpenGLCurrentDrawFBO);
    }

}